

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_display_driver.cpp
# Opt level: O1

void __thiscall HtmlDisplayDriver::display(HtmlDisplayDriver *this,Document *doc,ostream *output)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  undefined4 uVar7;
  int iVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  ostream *poVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  long *local_68;
  long local_60;
  long local_58 [2];
  HtmlDisplayDriver *local_48;
  Document *local_40;
  ulong local_38;
  
  cVar1 = (char)output;
  local_48 = this;
  if (this->field_0x8 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(output,"<!doctype html>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"<html lang=\"fr\">",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"<head>",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"<meta charset=\"utf-8\">",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (output,"<title>mdl generated HTML page</title>",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"</head>",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"<body>",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  lVar9 = Document::size();
  if (lVar9 != 0) {
    uVar16 = 0;
    bVar4 = false;
    bVar5 = false;
    bVar2 = false;
    bVar3 = false;
    local_40 = doc;
    do {
      plVar10 = (long *)Document::operator[]((ulong)doc);
      uVar7 = (**(code **)(*plVar10 + 8))(plVar10);
      local_38 = uVar16;
      switch(uVar7) {
      case 1:
        pcVar15 = "<h1>";
        break;
      case 2:
        pcVar15 = "<h2>";
        break;
      case 3:
        pcVar15 = "<h3>";
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>(output,"<p>",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        goto LAB_00123012;
      case 7:
        if (!bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"<ol>",4);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          bVar4 = true;
        }
        goto LAB_00122ffe;
      case 8:
        if (!bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"<ul>",4);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          bVar5 = true;
        }
LAB_00122ffe:
        pcVar15 = "<li>";
        break;
      case 10:
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"<blockquote>",0xc);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          bVar2 = true;
        }
        goto LAB_00123012;
      case 0xb:
        if (!bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"<code>",6);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          bVar3 = true;
        }
        goto LAB_00123012;
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,pcVar15,4);
LAB_00123012:
      lVar9 = Paragraph::size();
      if (lVar9 != 0) {
        uVar16 = 0;
        do {
          plVar11 = (long *)Paragraph::operator[]((ulong)plVar10);
          bVar18 = true;
          bVar17 = true;
          if (plVar11 == (long *)0x0) {
            bVar19 = true;
            lVar9 = 0;
          }
          else {
            lVar9 = __dynamic_cast(plVar11,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
            bVar17 = lVar9 == 0;
            lVar9 = __dynamic_cast(plVar11,&LineElement::typeinfo,&ItalicLineElement::typeinfo,0);
            bVar18 = lVar9 == 0;
            lVar9 = __dynamic_cast(plVar11,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
            bVar19 = lVar9 == 0;
            lVar9 = __dynamic_cast(plVar11,&LineElement::typeinfo,&UrlLineElement::typeinfo,0);
          }
          if (bVar18) {
            if (!bVar17) {
              lVar14 = 3;
              pcVar15 = "<b>";
              goto LAB_00123193;
            }
            if ((!bVar19) && (iVar8 = (**(code **)(*plVar10 + 8))(), iVar8 != 0xb)) {
              lVar14 = 6;
              pcVar15 = "<code>";
              goto LAB_00123193;
            }
            if (lVar9 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>(output,"<a href=\"",9);
              UrlLineElement::url_abi_cxx11_();
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (output,(char *)local_68,local_60);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\">",2);
              if (local_68 != local_58) {
                operator_delete(local_68,local_58[0] + 1);
              }
            }
          }
          else {
            lVar14 = 3;
            pcVar15 = "<i>";
LAB_00123193:
            std::__ostream_insert<char,std::char_traits<char>>(output,pcVar15,lVar14);
          }
          (**(code **)(*plVar11 + 0x10))(&local_68,plVar11);
          std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_68,local_60);
          if (local_68 != local_58) {
            operator_delete(local_68,local_58[0] + 1);
          }
          if (lVar9 == 0) {
            if (bVar17) {
              if (bVar18) {
                if ((bVar19) || (iVar8 = (**(code **)(*plVar10 + 8))(plVar10), iVar8 == 0xb))
                goto LAB_0012324b;
                lVar9 = 7;
                pcVar15 = "</code>";
              }
              else {
                lVar9 = 4;
                pcVar15 = "</i>";
              }
              std::__ostream_insert<char,std::char_traits<char>>(output,pcVar15,lVar9);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(output,"</b>",4);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(output,"</a>",4);
          }
LAB_0012324b:
          uVar16 = uVar16 + 1;
          uVar13 = Paragraph::size();
        } while (uVar16 < uVar13);
      }
      uVar7 = (**(code **)(*plVar10 + 8))(plVar10);
      switch(uVar7) {
      case 1:
        lVar9 = 5;
        pcVar15 = "</h1>";
        break;
      case 2:
        lVar9 = 5;
        pcVar15 = "</h2>";
        break;
      case 3:
        lVar9 = 5;
        pcVar15 = "</h3>";
        break;
      default:
        lVar9 = 4;
        pcVar15 = "</p>";
        break;
      case 7:
        std::__ostream_insert<char,std::char_traits<char>>(output,"</li>",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        cVar6 = Paragraph::last();
        if (cVar6 == '\0') goto LAB_0012342f;
        std::__ostream_insert<char,std::char_traits<char>>(output,"</ol>",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        poVar12 = (ostream *)std::ostream::flush();
        bVar4 = false;
        goto LAB_00123408;
      case 8:
        std::__ostream_insert<char,std::char_traits<char>>(output,"</li>",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        cVar6 = Paragraph::last();
        if (cVar6 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(output,"</ul>",5);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          poVar12 = (ostream *)std::ostream::flush();
          bVar5 = false;
          goto LAB_00123408;
        }
        goto LAB_0012342f;
      case 10:
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        cVar6 = Paragraph::last();
        if (cVar6 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(output,"</blockquote>",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          poVar12 = (ostream *)std::ostream::flush();
          bVar2 = false;
          goto LAB_00123408;
        }
        goto LAB_0012342f;
      case 0xb:
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        cVar6 = Paragraph::last();
        if (cVar6 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(output,"</code>",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          poVar12 = (ostream *)std::ostream::flush();
          bVar3 = false;
          goto LAB_00123408;
        }
        goto LAB_0012342f;
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,pcVar15,lVar9);
      poVar12 = output;
LAB_00123408:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
LAB_0012342f:
      doc = local_40;
      uVar16 = local_38 + 1;
      uVar13 = Document::size();
    } while (uVar16 < uVar13);
  }
  if (local_48->field_0x8 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(output,"</body>",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"</html>",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void HtmlDisplayDriver::display(Document *doc, ostream & output) {
	Paragraph *p = nullptr;
	LineElement *l = nullptr;

	BoldLineElement *bold_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	CodeLineElement *code_le(nullptr);
	UrlLineElement *url_le(nullptr);

	bool is_verbatim(false), 
		 is_quotation(false),
		 is_ulist(false),
		 is_olist(false);

	if (_standalone) {
		output << "<!doctype html>" << endl;
		output << "<html lang=\"fr\">" << endl;
		output << "<head>" << endl;
		output << "<meta charset=\"utf-8\">" << endl;
		output << "<title>mdl generated HTML page</title>" << endl;
		output << "</head>" << endl;
		output << "<body>" << endl;
	}

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << "<h1>";
				break;
			case Paragraph::Level::Title2:
				output << "<h2>";
				break;
			case Paragraph::Level::Title3:
				output << "<h3>";
				break;
			case Paragraph::Level::Code:
				if (!is_verbatim) {
					output << "<code>" << endl;
					is_verbatim = true;
				}
				break;
			case Paragraph::Level::UList1:
				if (!is_ulist) {
					output << "<ul>" << endl;
					is_ulist = true;
				}
				output << "<li>";
				break;
			case Paragraph::Level::OList1:
				if (!is_olist) {
					output << "<ol>" << endl;
					is_olist = true;
				}
				output << "<li>";
				break;
			case Paragraph::Level::Quote:
				if (!is_quotation) {
					output << "<blockquote>" << endl;
					is_quotation = true;
				}
				break;
			default:
				output << "<p>" << endl;
				break;
		}

		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];

			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);

			if (italic_le) {
				output << "<i>";
			} else if (bold_le) {
				output << "<b>";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
				output << "<code>";
			} else if (url_le) {
				output << "<a href=\"" << url_le->url() << "\">";
			}

			output << l->content();

			if (url_le) {
				output << "</a>";
			} else if (bold_le) {
				output << "</b>";
			} else if (italic_le) {
				output << "</i>";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
				output << "</code>";
			}
		}
		
		switch (p->level()) {
			case Paragraph::Level::Code:
				output << endl;
				if (p->last()) {
					output << "</code>" << endl << endl;
					is_verbatim = false;
				}
				break;
			case Paragraph::Level::Quote:
				output << endl;
				if (p->last()) {
					output << "</blockquote>" << endl << endl;
					is_quotation = false;
				}
				break;
			case Paragraph::Level::UList1:
				output << "</li>" << endl;
				if (p->last()) {
					output << "</ul>" << endl << endl;
					is_ulist = false;
				}
				break;
			case Paragraph::Level::OList1:
				output << "</li>" << endl;
				if (p->last()) {
					output << "</ol>" << endl << endl;
					is_olist = false;
				}
				break;
			case Paragraph::Level::Title1:
				output << "</h1>" << endl;
				break;
			case Paragraph::Level::Title2:
				output << "</h2>" << endl;
				break;
			case Paragraph::Level::Title3:
				output << "</h3>" << endl;
				break;
			default:
				output << "</p>" << endl;
				break;
		}
	}
	if (_standalone) {
		output << "</body>" << endl;
		output << "</html>" << endl;
	}
}